

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexTest.cpp
# Opt level: O0

void __thiscall oout::RegexTest::RegexTest(RegexTest *this,string *text,string *re)

{
  undefined1 local_40 [16];
  shared_ptr<const_oout::Text> local_30;
  string *local_20;
  string *re_local;
  string *text_local;
  RegexTest *this_local;
  
  local_20 = re;
  re_local = text;
  text_local = (string *)this;
  std::make_shared<oout::StringText,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::shared_ptr<oout::Text_const>::shared_ptr<oout::StringText,void>
            ((shared_ptr<oout::Text_const> *)&local_30,(shared_ptr<oout::StringText> *)local_40);
  RegexTest(this,&local_30,local_20);
  std::shared_ptr<const_oout::Text>::~shared_ptr(&local_30);
  std::shared_ptr<oout::StringText>::~shared_ptr((shared_ptr<oout::StringText> *)local_40);
  return;
}

Assistant:

RegexTest::RegexTest(const string &text, const string &re)
	: RegexTest(make_shared<StringText>(text), re)
{
}